

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void discordpp::to_json(json *j,field<bool> *f)

{
  logic_error *this;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  
  switch(f->s_) {
  case uninitialized_e:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"You can\'t convert an uninitialized field to JSON");
    goto LAB_00182930;
  case present_e:
    this_00 = &local_20;
    local_20.m_type = null;
    local_20.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_2::detail::
    external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)4>::
    construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (this_00,*(f->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                        super__Head_base<0UL,_bool_*,_false>._M_head_impl);
    break;
  case omitted_e:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"You can\'t convert an omitted field to JSON");
LAB_00182930:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case nulled_e:
    this_00 = &local_30;
    local_30.m_type = null;
    local_30.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(this_00,true);
    break;
  default:
    goto switchD_0018288d_default;
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(this_00,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(j,this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(this_00);
switchD_0018288d_default:
  return;
}

Assistant:

void to_json(nlohmann::json &j, const field<T> &f) {
        switch (f.s_) {
        case uninitialized_e:
            throw std::logic_error(
                "You can't convert an uninitialized field to JSON");
            break;
        case present_e:
            // if constexpr (std::is_enum_v<T>) {
            //     j = static_cast<typename
            //     std::underlying_type<T>::type>(*f.t_);
            // } else {
            j = *f.t_;
            //}
            break;
        case nulled_e:
            j = nullptr;
            break;
        case omitted_e:
            throw std::logic_error(
                "You can't convert an omitted field to JSON");
            break;
        }
    }